

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall cfd::core::ConfidentialTransaction::RandomSortTxOut(ConfidentialTransaction *this)

{
  uint uVar1;
  pointer pCVar2;
  ulong uVar3;
  CfdException *this_00;
  ulong uVar4;
  size_t index;
  long lVar5;
  Amount AVar6;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_160;
  ConfidentialTransaction *local_148;
  ulong local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Amount local_120;
  ConfidentialValue local_110;
  Script local_e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ConfidentialAssetId local_80;
  ConfidentialNonce local_58;
  
  GetTxOutList(&local_160,this);
  lVar5 = 0x78;
  uVar4 = 0;
  while( true ) {
    uVar3 = ((long)local_160.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_160.
                  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xf8;
    if (uVar3 <= uVar4) {
      for (; uVar3 != 0; uVar3 = uVar3 - 1) {
        RemoveTxOut(this,(int)uVar3 - 1);
      }
      local_148 = this;
      RandomNumberUtil::GetRandomIndexes
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexes,
                 (uint32_t)
                 (((long)local_160.
                         super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_160.
                        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xf8));
      uVar4 = 0;
      while (pCVar2 = local_160.
                      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar4 < (ulong)((long)indexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)indexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2)) {
        uVar1 = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        local_140 = uVar4;
        ConfidentialValue::ConfidentialValue
                  (&local_110,
                   &local_160.
                    super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar1].confidential_value_);
        AVar6 = ConfidentialValue::GetAmount(&local_110);
        local_120.amount_ = AVar6.amount_;
        local_120.ignore_check_ = AVar6.ignore_check_;
        ConfidentialAssetId::ConfidentialAssetId(&local_80,&pCVar2[uVar1].asset_);
        Script::Script(&local_e8,&pCVar2[uVar1].super_AbstractTxOutReference.locking_script_);
        ConfidentialNonce::ConfidentialNonce(&local_58,&pCVar2[uVar1].nonce_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,
                   &pCVar2[uVar1].surjection_proof_.data_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,
                   &pCVar2[uVar1].range_proof_.data_);
        AddTxOut(local_148,&local_120,&local_80,&local_e8,&local_58,(ByteData *)&local_98,
                 (ByteData *)&local_b0);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98)
        ;
        ConfidentialNonce::~ConfidentialNonce(&local_58);
        Script::~Script(&local_e8);
        ConfidentialAssetId::~ConfidentialAssetId(&local_80);
        ConfidentialValue::~ConfidentialValue(&local_110);
        uVar4 = local_140 + 1;
      }
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      ::std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector(&local_160);
      return;
    }
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_e8,
               (ConfidentialValue *)
               ((long)&((local_160.
                         super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference).
                       _vptr_AbstractTxOutReference + lVar5));
    if (1 < (byte)local_e8.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_start) break;
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_e8);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0xf8;
  }
  local_110._vptr_ConfidentialValue = (_func_int **)0x4b5451;
  local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc23;
  local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "RandomSortTxOut";
  logger::warn<>((CfdSourceLocation *)&local_110,"already blinded tx");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_110,"already blinded tx",(allocator *)&local_80);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_110);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::RandomSortTxOut() {
  const std::vector<ConfidentialTxOutReference> &txout_list = GetTxOutList();
  // blind check
  for (size_t index = 0; index < txout_list.size(); ++index) {
    const ConfidentialValue &value = txout_list[index].GetConfidentialValue();
    if (value.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "already blinded tx");
      throw CfdException(kCfdIllegalArgumentError, "already blinded tx");
    }
  }
  for (size_t index = txout_list.size(); index > 0; --index) {
    RemoveTxOut(static_cast<uint32_t>(index - 1));
  }

  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(
      static_cast<uint32_t>(txout_list.size()));
  for (size_t index = 0; index < indexes.size(); ++index) {
    const ConfidentialTxOutReference &txout = txout_list[indexes[index]];
    AddTxOut(
        txout.GetConfidentialValue().GetAmount(), txout.GetAsset(),
        txout.GetLockingScript(), txout.GetNonce(), txout.GetSurjectionProof(),
        txout.GetRangeProof());
  }
}